

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_fma_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [24];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar75;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar76 [32];
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_pow op;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z_1;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_2;
  v4si emm0;
  int local_22f4;
  undefined8 *local_22e0;
  undefined1 (*local_22d0) [32];
  float local_2180;
  float fStack_217c;
  float fStack_2178;
  float fStack_2174;
  float fStack_2170;
  float fStack_216c;
  float fStack_2168;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  undefined4 uStack_2144;
  undefined1 local_2120 [8];
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined1 local_2080 [8];
  float fStack_2078;
  float fStack_2074;
  undefined1 local_2060 [8];
  float fStack_2058;
  float fStack_2054;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  float local_2020;
  float fStack_201c;
  float fStack_2018;
  float fStack_2014;
  float local_1fc0;
  float fStack_1fbc;
  float fStack_1fb8;
  float fStack_1fb4;
  float fStack_1fb0;
  float fStack_1fac;
  float fStack_1fa8;
  float local_1f60;
  float fStack_1f5c;
  float fStack_1f58;
  float fStack_1f54;
  undefined1 local_1ec0 [8];
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1e40 [8];
  float fStack_1e38;
  float fStack_1e34;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined1 local_1dc0 [8];
  float fStack_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  float local_1d40;
  float fStack_1d3c;
  float fStack_1d38;
  float fStack_1d34;
  float fStack_1d30;
  float fStack_1d2c;
  float fStack_1d28;
  float fStack_1d24;
  float local_1d00;
  float fStack_1cfc;
  float fStack_1cf8;
  float fStack_1cf4;
  float fStack_1cf0;
  float fStack_1cec;
  float fStack_1ce8;
  float fStack_1ce4;
  float local_1c00;
  float fStack_1bfc;
  float fStack_1bf8;
  float fStack_1bf4;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 local_c20;
  undefined8 uStack_c18;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  undefined1 local_ad0 [8];
  undefined8 uStack_ac8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined8 local_a70;
  undefined8 uStack_a68;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_920 [8];
  undefined8 uStack_918;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  
  local_22f4 = 0;
  fVar1 = *in_RSI;
  auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
  auVar4 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar1),0x30);
  local_22e0 = in_RDX;
  local_22d0 = in_RDI;
  for (; local_22f4 + 7 < in_ECX * in_R8D; local_22f4 = local_22f4 + 8) {
    auVar2 = vcmpps_avx(*local_22d0,ZEXT1632(ZEXT816(0)),2);
    auVar6._8_8_ = 0x80000000800000;
    auVar6._0_8_ = 0x80000000800000;
    auVar6._16_8_ = 0x80000000800000;
    auVar6._24_8_ = 0x80000000800000;
    auVar5 = vmaxps_avx(*local_22d0,auVar6);
    auVar7 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
    auVar8 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
    auVar12._8_8_ = 0x807fffff807fffff;
    auVar12._0_8_ = 0x807fffff807fffff;
    auVar12._16_8_ = 0x807fffff807fffff;
    auVar12._24_8_ = 0x807fffff807fffff;
    auVar5 = vandps_avx(auVar5,auVar12);
    auVar36._8_8_ = 0x3f0000003f000000;
    auVar36._0_8_ = 0x3f0000003f000000;
    auVar36._16_8_ = 0x3f0000003f000000;
    auVar36._24_8_ = 0x3f0000003f000000;
    auVar6 = vorps_avx(auVar5,auVar36);
    auVar39._8_8_ = 0x7f0000007f;
    auVar39._0_8_ = 0x7f0000007f;
    auVar7 = vpsubd_avx(auVar7,auVar39);
    auVar38._8_8_ = 0x7f0000007f;
    auVar38._0_8_ = 0x7f0000007f;
    auVar8 = vpsubd_avx(auVar8,auVar38);
    local_c20 = auVar8._0_8_;
    uStack_c18 = auVar8._8_8_;
    auVar37._16_8_ = local_c20;
    auVar37._0_16_ = auVar7;
    auVar37._24_8_ = uStack_c18;
    auVar5 = vcvtdq2ps_avx(auVar37);
    local_1d00 = auVar5._0_4_;
    fStack_1cfc = auVar5._4_4_;
    fStack_1cf8 = auVar5._8_4_;
    fStack_1cf4 = auVar5._12_4_;
    fStack_1cf0 = auVar5._16_4_;
    fStack_1cec = auVar5._20_4_;
    fStack_1ce8 = auVar5._24_4_;
    fStack_1ce4 = auVar5._28_4_;
    local_1e40._4_4_ = fStack_1cfc + 1.0;
    local_1e40._0_4_ = local_1d00 + 1.0;
    fStack_1e38 = fStack_1cf8 + 1.0;
    fStack_1e34 = fStack_1cf4 + 1.0;
    uStack_1e30._0_4_ = fStack_1cf0 + 1.0;
    uStack_1e30._4_4_ = fStack_1cec + 1.0;
    uStack_1e28._0_4_ = fStack_1ce8 + 1.0;
    uStack_1e28._4_4_ = fStack_1ce4 + 1.0;
    auVar9 = _local_1e40;
    auVar76 = vcmpps_avx(auVar6,_DAT_01f93560,1);
    auVar5 = vandps_avx(auVar6,auVar76);
    auVar10._8_8_ = 0x3f8000003f800000;
    auVar10._0_8_ = 0x3f8000003f800000;
    auVar10._16_8_ = 0x3f8000003f800000;
    auVar10._24_8_ = 0x3f8000003f800000;
    auVar6 = vsubps_avx(auVar6,auVar10);
    uStack_1e28 = auVar9._24_8_;
    auVar11._8_8_ = 0x3f8000003f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._16_8_ = 0x3f8000003f800000;
    auVar11._24_8_ = 0x3f8000003f800000;
    auVar76 = vandps_avx(auVar11,auVar76);
    auVar9._16_8_ = uStack_1e30;
    auVar9._0_16_ = _local_1e40;
    auVar9._24_8_ = uStack_1e28;
    auVar76 = vsubps_avx(auVar9,auVar76);
    local_1d40 = auVar6._0_4_;
    fStack_1d3c = auVar6._4_4_;
    fStack_1d38 = auVar6._8_4_;
    fStack_1d34 = auVar6._12_4_;
    fStack_1d30 = auVar6._16_4_;
    fStack_1d2c = auVar6._20_4_;
    fStack_1d28 = auVar6._24_4_;
    fStack_1d24 = auVar6._28_4_;
    local_1d60 = auVar5._0_4_;
    fStack_1d5c = auVar5._4_4_;
    fStack_1d58 = auVar5._8_4_;
    fStack_1d54 = auVar5._12_4_;
    fStack_1d50 = auVar5._16_4_;
    fStack_1d4c = auVar5._20_4_;
    fStack_1d48 = auVar5._24_4_;
    fStack_1d44 = auVar5._28_4_;
    local_1dc0._0_4_ = local_1d40 + local_1d60;
    local_1dc0._4_4_ = fStack_1d3c + fStack_1d5c;
    fStack_1db8 = fStack_1d38 + fStack_1d58;
    fStack_1db4 = fStack_1d34 + fStack_1d54;
    fStack_1db0 = fStack_1d30 + fStack_1d50;
    fStack_1dac = fStack_1d2c + fStack_1d4c;
    fStack_1da8 = fStack_1d28 + fStack_1d48;
    fStack_1da4 = fStack_1d24 + fStack_1d44;
    uStack_1eb8 = 0x3d9021bb3d9021bb;
    local_1ec0 = (undefined1  [8])0x3d9021bb3d9021bb;
    uStack_1eb0 = 0x3d9021bb3d9021bb;
    uStack_1ea8 = 0x3d9021bb3d9021bb;
    auVar21._8_4_ = -0.1151461;
    auVar21._12_4_ = -0.1151461;
    auVar21._0_4_ = -0.1151461;
    auVar21._4_4_ = -0.1151461;
    auVar21._16_4_ = -0.1151461;
    auVar21._20_4_ = -0.1151461;
    auVar21._24_4_ = -0.1151461;
    auVar21._28_4_ = -0.1151461;
    auVar7 = vfmadd213ps_fma(_local_1dc0,_local_1ec0,auVar21);
    auVar22._8_4_ = 0.116769984;
    auVar22._12_4_ = 0.116769984;
    auVar22._0_4_ = 0.116769984;
    auVar22._4_4_ = 0.116769984;
    auVar22._16_4_ = 0.116769984;
    auVar22._20_4_ = 0.116769984;
    auVar22._24_4_ = 0.116769984;
    auVar22._28_4_ = 0.116769984;
    auVar7 = vfmadd213ps_fma(_local_1dc0,ZEXT1632(auVar7),auVar22);
    auVar23._8_4_ = -0.12420141;
    auVar23._12_4_ = -0.12420141;
    auVar23._0_4_ = -0.12420141;
    auVar23._4_4_ = -0.12420141;
    auVar23._16_4_ = -0.12420141;
    auVar23._20_4_ = -0.12420141;
    auVar23._24_4_ = -0.12420141;
    auVar23._28_4_ = -0.12420141;
    auVar7 = vfmadd213ps_fma(_local_1dc0,ZEXT1632(auVar7),auVar23);
    auVar24._8_4_ = 0.14249323;
    auVar24._12_4_ = 0.14249323;
    auVar24._0_4_ = 0.14249323;
    auVar24._4_4_ = 0.14249323;
    auVar24._16_4_ = 0.14249323;
    auVar24._20_4_ = 0.14249323;
    auVar24._24_4_ = 0.14249323;
    auVar24._28_4_ = 0.14249323;
    auVar7 = vfmadd213ps_fma(_local_1dc0,ZEXT1632(auVar7),auVar24);
    auVar25._8_4_ = -0.16668057;
    auVar25._12_4_ = -0.16668057;
    auVar25._0_4_ = -0.16668057;
    auVar25._4_4_ = -0.16668057;
    auVar25._16_4_ = -0.16668057;
    auVar25._20_4_ = -0.16668057;
    auVar25._24_4_ = -0.16668057;
    auVar25._28_4_ = -0.16668057;
    auVar7 = vfmadd213ps_fma(_local_1dc0,ZEXT1632(auVar7),auVar25);
    auVar26._8_4_ = 0.20000714;
    auVar26._12_4_ = 0.20000714;
    auVar26._0_4_ = 0.20000714;
    auVar26._4_4_ = 0.20000714;
    auVar26._16_4_ = 0.20000714;
    auVar26._20_4_ = 0.20000714;
    auVar26._24_4_ = 0.20000714;
    auVar26._28_4_ = 0.20000714;
    auVar7 = vfmadd213ps_fma(_local_1dc0,ZEXT1632(auVar7),auVar26);
    auVar27._8_4_ = -0.24999994;
    auVar27._12_4_ = -0.24999994;
    auVar27._0_4_ = -0.24999994;
    auVar27._4_4_ = -0.24999994;
    auVar27._16_4_ = -0.24999994;
    auVar27._20_4_ = -0.24999994;
    auVar27._24_4_ = -0.24999994;
    auVar27._28_4_ = -0.24999994;
    auVar7 = vfmadd213ps_fma(_local_1dc0,ZEXT1632(auVar7),auVar27);
    auVar28._8_4_ = 0.3333333;
    auVar28._12_4_ = 0.3333333;
    auVar28._0_4_ = 0.3333333;
    auVar28._4_4_ = 0.3333333;
    auVar28._16_4_ = 0.3333333;
    auVar28._20_4_ = 0.3333333;
    auVar28._24_4_ = 0.3333333;
    auVar28._28_4_ = 0.3333333;
    auVar7 = vfmadd213ps_fma(_local_1dc0,ZEXT1632(auVar7),auVar28);
    local_1c00 = auVar7._0_4_;
    fStack_1bfc = auVar7._4_4_;
    fStack_1bf8 = auVar7._8_4_;
    fStack_1bf4 = auVar7._12_4_;
    local_1ec0._4_4_ =
         fStack_1bfc * (float)local_1dc0._4_4_ * (float)local_1dc0._4_4_ * (float)local_1dc0._4_4_;
    local_1ec0._0_4_ =
         local_1c00 * (float)local_1dc0._0_4_ * (float)local_1dc0._0_4_ * (float)local_1dc0._0_4_;
    uStack_1eb8._0_4_ = fStack_1bf8 * fStack_1db8 * fStack_1db8 * fStack_1db8;
    uStack_1eb8._4_4_ = fStack_1bf4 * fStack_1db4 * fStack_1db4 * fStack_1db4;
    uStack_1eb0._0_4_ = fStack_1db0 * 0.0 * fStack_1db0 * fStack_1db0;
    uStack_1eb0._4_4_ = fStack_1dac * 0.0 * fStack_1dac * fStack_1dac;
    uStack_1ea8._0_4_ = fStack_1da8 * 0.0 * fStack_1da8 * fStack_1da8;
    uStack_1ea8._4_4_ = 0;
    auVar29._8_4_ = -0.00021219444;
    auVar29._12_4_ = -0.00021219444;
    auVar29._0_4_ = -0.00021219444;
    auVar29._4_4_ = -0.00021219444;
    auVar29._16_4_ = -0.00021219444;
    auVar29._20_4_ = -0.00021219444;
    auVar29._24_4_ = -0.00021219444;
    auVar29._28_4_ = -0.00021219444;
    auVar7 = vfmadd213ps_fma(auVar29,auVar76,_local_1ec0);
    auVar72._4_4_ = (float)local_1dc0._4_4_ * (float)local_1dc0._4_4_;
    auVar72._0_4_ = (float)local_1dc0._0_4_ * (float)local_1dc0._0_4_;
    auVar72._8_4_ = fStack_1db8 * fStack_1db8;
    auVar72._12_4_ = fStack_1db4 * fStack_1db4;
    auVar72._16_4_ = fStack_1db0 * fStack_1db0;
    auVar72._20_4_ = fStack_1dac * fStack_1dac;
    auVar72._24_4_ = fStack_1da8 * fStack_1da8;
    auVar72._28_4_ = fStack_1da4;
    auVar33._8_4_ = 0.5;
    auVar33._12_4_ = 0.5;
    auVar33._0_4_ = 0.5;
    auVar33._4_4_ = 0.5;
    auVar33._16_4_ = 0.5;
    auVar33._20_4_ = 0.5;
    auVar33._24_4_ = 0.5;
    auVar33._28_4_ = 0.5;
    auVar7 = vfnmadd213ps_fma(auVar33,auVar72,ZEXT1632(auVar7));
    local_1da0 = auVar7._0_4_;
    fStack_1d9c = auVar7._4_4_;
    fStack_1d98 = auVar7._8_4_;
    fStack_1d94 = auVar7._12_4_;
    local_1dc0._4_4_ = (float)local_1dc0._4_4_ + fStack_1d9c;
    local_1dc0._0_4_ = (float)local_1dc0._0_4_ + local_1da0;
    fStack_1db8 = fStack_1db8 + fStack_1d98;
    fStack_1db4 = fStack_1db4 + fStack_1d94;
    fStack_1db0 = fStack_1db0 + 0.0;
    fStack_1dac = fStack_1dac + 0.0;
    fStack_1da8 = fStack_1da8 + 0.0;
    fStack_1da4 = fStack_1da4 + 0.0;
    auVar30._8_4_ = 0.6933594;
    auVar30._12_4_ = 0.6933594;
    auVar30._0_4_ = 0.6933594;
    auVar30._4_4_ = 0.6933594;
    auVar30._16_4_ = 0.6933594;
    auVar30._20_4_ = 0.6933594;
    auVar30._24_4_ = 0.6933594;
    auVar30._28_4_ = 0.6933594;
    auVar7 = vfmadd213ps_fma(auVar30,auVar76,_local_1dc0);
    auVar5 = vorps_avx(ZEXT1632(auVar7),auVar2);
    local_2160 = auVar4._0_4_;
    fStack_215c = auVar4._4_4_;
    fStack_2158 = auVar4._8_4_;
    fStack_2154 = auVar4._12_4_;
    fStack_2150 = auVar3._0_4_;
    fStack_214c = auVar3._4_4_;
    fStack_2148 = auVar3._8_4_;
    uStack_2144 = auVar3._12_4_;
    local_2180 = auVar5._0_4_;
    fStack_217c = auVar5._4_4_;
    fStack_2178 = auVar5._8_4_;
    fStack_2174 = auVar5._12_4_;
    fStack_2170 = auVar5._16_4_;
    fStack_216c = auVar5._20_4_;
    fStack_2168 = auVar5._24_4_;
    local_2060._4_4_ = fStack_215c * fStack_217c;
    local_2060._0_4_ = local_2160 * local_2180;
    fStack_2058 = fStack_2158 * fStack_2178;
    fStack_2054 = fStack_2154 * fStack_2174;
    uStack_2050._0_4_ = fStack_2150 * fStack_2170;
    uStack_2050._4_4_ = fStack_214c * fStack_216c;
    uStack_2048._0_4_ = fStack_2148 * fStack_2168;
    uStack_2048._4_4_ = uStack_2144;
    auVar5 = _local_2060;
    uStack_2048 = auVar5._24_8_;
    auVar2._16_8_ = uStack_2050;
    auVar2._0_16_ = _local_2060;
    auVar2._24_8_ = uStack_2048;
    auVar5._8_8_ = 0x42b0c0a542b0c0a5;
    auVar5._0_8_ = 0x42b0c0a542b0c0a5;
    auVar5._16_8_ = 0x42b0c0a542b0c0a5;
    auVar5._24_8_ = 0x42b0c0a542b0c0a5;
    auVar5 = vminps_avx(auVar2,auVar5);
    auVar76._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar76._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar76._16_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar76._24_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar76 = vmaxps_avx(auVar5,auVar76);
    auVar15._8_4_ = 1.442695;
    auVar15._12_4_ = 1.442695;
    auVar15._0_4_ = 1.442695;
    auVar15._4_4_ = 1.442695;
    auVar15._16_4_ = 1.442695;
    auVar15._20_4_ = 1.442695;
    auVar15._24_4_ = 1.442695;
    auVar15._28_4_ = 1.442695;
    auVar14._8_4_ = 0.5;
    auVar14._12_4_ = 0.5;
    auVar14._0_4_ = 0.5;
    auVar14._4_4_ = 0.5;
    auVar14._16_4_ = 0.5;
    auVar14._20_4_ = 0.5;
    auVar14._24_4_ = 0.5;
    auVar14._28_4_ = 0.5;
    auVar7 = vfmadd213ps_fma(auVar15,auVar76,auVar14);
    auVar2 = vroundps_avx(ZEXT1632(auVar7),1);
    auVar5 = vcmpps_avx(ZEXT1632(auVar7),auVar2,1);
    auVar13._8_8_ = 0x3f8000003f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._16_8_ = 0x3f8000003f800000;
    auVar13._24_8_ = 0x3f8000003f800000;
    auVar5 = vandps_avx(auVar5,auVar13);
    auVar5 = vsubps_avx(auVar2,auVar5);
    auVar31._8_4_ = 0.6933594;
    auVar31._12_4_ = 0.6933594;
    auVar31._0_4_ = 0.6933594;
    auVar31._4_4_ = 0.6933594;
    auVar31._16_4_ = 0.6933594;
    auVar31._20_4_ = 0.6933594;
    auVar31._24_4_ = 0.6933594;
    auVar31._28_4_ = 0.6933594;
    auVar7 = vfnmadd213ps_fma(auVar31,auVar5,auVar76);
    auVar32._8_4_ = -0.00021219444;
    auVar32._12_4_ = -0.00021219444;
    auVar32._0_4_ = -0.00021219444;
    auVar32._4_4_ = -0.00021219444;
    auVar32._16_4_ = -0.00021219444;
    auVar32._20_4_ = -0.00021219444;
    auVar32._24_4_ = -0.00021219444;
    auVar32._28_4_ = -0.00021219444;
    auVar7 = vfnmadd213ps_fma(auVar32,auVar5,ZEXT1632(auVar7));
    auVar76 = ZEXT1632(auVar7);
    local_1f60 = auVar7._0_4_;
    fStack_1f5c = auVar7._4_4_;
    fStack_1f58 = auVar7._8_4_;
    fStack_1f54 = auVar7._12_4_;
    _local_2080 = ZEXT1632(CONCAT412(fStack_1f54 * fStack_1f54,
                                     CONCAT48(fStack_1f58 * fStack_1f58,
                                              CONCAT44(fStack_1f5c * fStack_1f5c,
                                                       local_1f60 * local_1f60))));
    uStack_2118 = 0x3950696739506967;
    local_2120 = (undefined1  [8])0x3950696739506967;
    uStack_2110 = 0x3950696739506967;
    uStack_2108 = 0x3950696739506967;
    auVar16._8_4_ = 0.0013981999;
    auVar16._12_4_ = 0.0013981999;
    auVar16._0_4_ = 0.0013981999;
    auVar16._4_4_ = 0.0013981999;
    auVar16._16_4_ = 0.0013981999;
    auVar16._20_4_ = 0.0013981999;
    auVar16._24_4_ = 0.0013981999;
    auVar16._28_4_ = 0.0013981999;
    auVar7 = vfmadd213ps_fma(auVar76,_local_2120,auVar16);
    auVar17._8_4_ = 0.008333452;
    auVar17._12_4_ = 0.008333452;
    auVar17._0_4_ = 0.008333452;
    auVar17._4_4_ = 0.008333452;
    auVar17._16_4_ = 0.008333452;
    auVar17._20_4_ = 0.008333452;
    auVar17._24_4_ = 0.008333452;
    auVar17._28_4_ = 0.008333452;
    auVar7 = vfmadd213ps_fma(auVar76,ZEXT1632(auVar7),auVar17);
    auVar18._8_4_ = 0.041665796;
    auVar18._12_4_ = 0.041665796;
    auVar18._0_4_ = 0.041665796;
    auVar18._4_4_ = 0.041665796;
    auVar18._16_4_ = 0.041665796;
    auVar18._20_4_ = 0.041665796;
    auVar18._24_4_ = 0.041665796;
    auVar18._28_4_ = 0.041665796;
    auVar7 = vfmadd213ps_fma(auVar76,ZEXT1632(auVar7),auVar18);
    auVar19._8_4_ = 0.16666666;
    auVar19._12_4_ = 0.16666666;
    auVar19._0_4_ = 0.16666666;
    auVar19._4_4_ = 0.16666666;
    auVar19._16_4_ = 0.16666666;
    auVar19._20_4_ = 0.16666666;
    auVar19._24_4_ = 0.16666666;
    auVar19._28_4_ = 0.16666666;
    auVar7 = vfmadd213ps_fma(auVar76,ZEXT1632(auVar7),auVar19);
    auVar20._8_4_ = 0.5;
    auVar20._12_4_ = 0.5;
    auVar20._0_4_ = 0.5;
    auVar20._4_4_ = 0.5;
    auVar20._16_4_ = 0.5;
    auVar20._20_4_ = 0.5;
    auVar20._24_4_ = 0.5;
    auVar20._28_4_ = 0.5;
    auVar7 = vfmadd213ps_fma(auVar76,ZEXT1632(auVar7),auVar20);
    auVar7 = vfmadd213ps_fma(_local_2080,ZEXT1632(auVar7),auVar76);
    local_2020 = auVar7._0_4_;
    fStack_201c = auVar7._4_4_;
    fStack_2018 = auVar7._8_4_;
    fStack_2014 = auVar7._12_4_;
    local_1820 = auVar5._0_4_;
    fStack_181c = auVar5._4_4_;
    fStack_1818 = auVar5._8_4_;
    fStack_1814 = auVar5._12_4_;
    fStack_1810 = auVar5._16_4_;
    fStack_180c = auVar5._20_4_;
    fStack_1808 = auVar5._24_4_;
    fStack_1804 = auVar5._28_4_;
    local_20c0 = CONCAT44((int)fStack_181c,(int)local_1820);
    uStack_20b8 = CONCAT44((int)fStack_1814,(int)fStack_1818);
    uStack_20b0 = CONCAT44((int)fStack_180c,(int)fStack_1810);
    uStack_20a8 = CONCAT44((int)fStack_1804,(int)fStack_1808);
    auVar35._8_8_ = uStack_20b8;
    auVar35._0_8_ = local_20c0;
    auVar7._8_8_ = 0x7f0000007f;
    auVar7._0_8_ = 0x7f0000007f;
    auVar7 = vpaddd_avx(auVar35,auVar7);
    auVar34._8_8_ = uStack_20a8;
    auVar34._0_8_ = uStack_20b0;
    auVar8._8_8_ = 0x7f0000007f;
    auVar8._0_8_ = 0x7f0000007f;
    auVar8 = vpaddd_avx(auVar34,auVar8);
    auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
    auVar8 = vpslld_avx(auVar8,ZEXT416(0x17));
    local_1fc0 = auVar7._0_4_;
    fStack_1fbc = auVar7._4_4_;
    fStack_1fb8 = auVar7._8_4_;
    fStack_1fb4 = auVar7._12_4_;
    fStack_1fb0 = auVar8._0_4_;
    fStack_1fac = auVar8._4_4_;
    fStack_1fa8 = auVar8._8_4_;
    local_2120._4_4_ = (fStack_201c + 1.0) * fStack_1fbc;
    local_2120._0_4_ = (local_2020 + 1.0) * local_1fc0;
    uStack_2118._0_4_ = (fStack_2018 + 1.0) * fStack_1fb8;
    uStack_2118._4_4_ = (fStack_2014 + 1.0) * fStack_1fb4;
    uStack_2110._0_4_ = fStack_1fb0 * 1.0;
    uStack_2110._4_4_ = fStack_1fac * 1.0;
    auVar74 = _local_2120;
    uStack_2108._0_4_ = fStack_1fa8 * 1.0;
    uStack_2108._4_4_ = 0x3f800000;
    auVar5 = _local_2120;
    uStack_2110 = auVar74._16_8_;
    uStack_2108 = auVar5._24_8_;
    *local_22e0 = local_2120;
    local_22e0[1] = uStack_2118;
    local_22e0[2] = uStack_2110;
    local_22e0[3] = uStack_2108;
    local_22d0 = local_22d0 + 1;
    local_22e0 = local_22e0 + 4;
  }
  fVar1 = *in_RSI;
  for (; local_22f4 + 3 < in_ECX * in_R8D; local_22f4 = local_22f4 + 4) {
    auVar3 = vcmpps_avx(*(undefined1 (*) [16])*local_22d0,ZEXT816(0),2);
    auVar45._8_8_ = 0x80000000800000;
    auVar45._0_8_ = 0x80000000800000;
    auVar4 = vmaxps_avx(*(undefined1 (*) [16])*local_22d0,auVar45);
    auVar7 = vpsrld_avx(auVar4,ZEXT416(0x17));
    auVar50._8_8_ = 0x807fffff807fffff;
    auVar50._0_8_ = 0x807fffff807fffff;
    auVar4 = vpand_avx(auVar4,auVar50);
    auVar70._8_8_ = 0x3f0000003f000000;
    auVar70._0_8_ = 0x3f0000003f000000;
    auVar8 = vpor_avx(auVar4,auVar70);
    auVar46._8_8_ = 0x7f0000007f;
    auVar46._0_8_ = 0x7f0000007f;
    auVar4 = vpsubd_avx(auVar7,auVar46);
    auVar4 = vcvtdq2ps_avx(auVar4);
    local_840 = auVar4._0_4_;
    fStack_83c = auVar4._4_4_;
    fStack_838 = auVar4._8_4_;
    fStack_834 = auVar4._12_4_;
    local_8e0 = CONCAT44(fStack_83c + 1.0,local_840 + 1.0);
    uStack_8d8._0_4_ = fStack_838 + 1.0;
    uStack_8d8._4_4_ = fStack_834 + 1.0;
    auVar71._8_8_ = 0x3f3504f33f3504f3;
    auVar71._0_8_ = 0x3f3504f33f3504f3;
    auVar4 = vcmpps_avx(auVar8,auVar71,1);
    auVar7 = vpand_avx(auVar8,auVar4);
    auVar44._8_8_ = 0x3f8000003f800000;
    auVar44._0_8_ = 0x3f8000003f800000;
    auVar8 = vsubps_avx(auVar8,auVar44);
    auVar49._8_8_ = 0x3f8000003f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    auVar4 = vpand_avx(auVar49,auVar4);
    auVar43._8_8_ = uStack_8d8;
    auVar43._0_8_ = local_8e0;
    auVar4 = vsubps_avx(auVar43,auVar4);
    local_860 = auVar8._0_4_;
    fStack_85c = auVar8._4_4_;
    fStack_858 = auVar8._8_4_;
    fStack_854 = auVar8._12_4_;
    local_870 = auVar7._0_4_;
    fStack_86c = auVar7._4_4_;
    fStack_868 = auVar7._8_4_;
    fStack_864 = auVar7._12_4_;
    local_8a0._0_4_ = local_860 + local_870;
    local_8a0._4_4_ = fStack_85c + fStack_86c;
    fStack_898 = fStack_858 + fStack_868;
    fStack_894 = fStack_854 + fStack_864;
    uStack_918 = 0x3d9021bb3d9021bb;
    local_920 = (undefined1  [8])0x3d9021bb3d9021bb;
    auVar60._8_4_ = -0.1151461;
    auVar60._12_4_ = -0.1151461;
    auVar60._0_4_ = -0.1151461;
    auVar60._4_4_ = -0.1151461;
    auVar7 = vfmadd213ps_fma(_local_8a0,_local_920,auVar60);
    auVar61._8_4_ = 0.116769984;
    auVar61._12_4_ = 0.116769984;
    auVar61._0_4_ = 0.116769984;
    auVar61._4_4_ = 0.116769984;
    auVar7 = vfmadd213ps_fma(_local_8a0,auVar7,auVar61);
    auVar62._8_4_ = -0.12420141;
    auVar62._12_4_ = -0.12420141;
    auVar62._0_4_ = -0.12420141;
    auVar62._4_4_ = -0.12420141;
    auVar7 = vfmadd213ps_fma(_local_8a0,auVar7,auVar62);
    auVar63._8_4_ = 0.14249323;
    auVar63._12_4_ = 0.14249323;
    auVar63._0_4_ = 0.14249323;
    auVar63._4_4_ = 0.14249323;
    auVar7 = vfmadd213ps_fma(_local_8a0,auVar7,auVar63);
    auVar64._8_4_ = -0.16668057;
    auVar64._12_4_ = -0.16668057;
    auVar64._0_4_ = -0.16668057;
    auVar64._4_4_ = -0.16668057;
    auVar7 = vfmadd213ps_fma(_local_8a0,auVar7,auVar64);
    auVar65._8_4_ = 0.20000714;
    auVar65._12_4_ = 0.20000714;
    auVar65._0_4_ = 0.20000714;
    auVar65._4_4_ = 0.20000714;
    auVar7 = vfmadd213ps_fma(_local_8a0,auVar7,auVar65);
    auVar66._8_4_ = -0.24999994;
    auVar66._12_4_ = -0.24999994;
    auVar66._0_4_ = -0.24999994;
    auVar66._4_4_ = -0.24999994;
    auVar7 = vfmadd213ps_fma(_local_8a0,auVar7,auVar66);
    auVar67._8_4_ = 0.3333333;
    auVar67._12_4_ = 0.3333333;
    auVar67._0_4_ = 0.3333333;
    auVar67._4_4_ = 0.3333333;
    auVar7 = vfmadd213ps_fma(_local_8a0,auVar7,auVar67);
    local_7c0 = auVar7._0_4_;
    fStack_7bc = auVar7._4_4_;
    fStack_7b8 = auVar7._8_4_;
    fStack_7b4 = auVar7._12_4_;
    local_920._4_4_ =
         fStack_7bc * (float)local_8a0._4_4_ * (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
    local_920._0_4_ =
         local_7c0 * (float)local_8a0._0_4_ * (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
    uStack_918._0_4_ = fStack_7b8 * fStack_898 * fStack_898 * fStack_898;
    uStack_918._4_4_ = fStack_7b4 * fStack_894 * fStack_894 * fStack_894;
    auVar68._8_4_ = -0.00021219444;
    auVar68._12_4_ = -0.00021219444;
    auVar68._0_4_ = -0.00021219444;
    auVar68._4_4_ = -0.00021219444;
    auVar7 = vfmadd213ps_fma(auVar68,auVar4,_local_920);
    auVar73._4_4_ = (float)local_8a0._4_4_ * (float)local_8a0._4_4_;
    auVar73._0_4_ = (float)local_8a0._0_4_ * (float)local_8a0._0_4_;
    auVar73._8_4_ = fStack_898 * fStack_898;
    auVar73._12_4_ = fStack_894 * fStack_894;
    auVar54._8_4_ = 0.5;
    auVar54._12_4_ = 0.5;
    auVar54._0_4_ = 0.5;
    auVar54._4_4_ = 0.5;
    auVar7 = vfnmadd213ps_fma(auVar54,auVar73,auVar7);
    local_890 = auVar7._0_4_;
    fStack_88c = auVar7._4_4_;
    fStack_888 = auVar7._8_4_;
    fStack_884 = auVar7._12_4_;
    local_8a0._4_4_ = (float)local_8a0._4_4_ + fStack_88c;
    local_8a0._0_4_ = (float)local_8a0._0_4_ + local_890;
    fStack_898 = fStack_898 + fStack_888;
    fStack_894 = fStack_894 + fStack_884;
    auVar69._8_4_ = 0.6933594;
    auVar69._12_4_ = 0.6933594;
    auVar69._0_4_ = 0.6933594;
    auVar69._4_4_ = 0.6933594;
    auVar4 = vfmadd213ps_fma(auVar69,auVar4,_local_8a0);
    auVar3 = vpor_avx(auVar4,auVar3);
    local_b00 = auVar3._0_4_;
    fStack_afc = auVar3._4_4_;
    fStack_af8 = auVar3._8_4_;
    fStack_af4 = auVar3._12_4_;
    local_a70 = CONCAT44(fVar1 * fStack_afc,fVar1 * local_b00);
    uStack_a68._0_4_ = fVar1 * fStack_af8;
    uStack_a68._4_4_ = fVar1 * fStack_af4;
    auVar40._8_8_ = uStack_a68;
    auVar40._0_8_ = local_a70;
    auVar3._8_8_ = 0x42b0c0a542b0c0a5;
    auVar3._0_8_ = 0x42b0c0a542b0c0a5;
    auVar3 = vminps_avx(auVar40,auVar3);
    auVar4._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar4._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar7 = vmaxps_avx(auVar3,auVar4);
    local_9b0 = auVar7._0_4_;
    fStack_9ac = auVar7._4_4_;
    fStack_9a8 = auVar7._8_4_;
    fStack_9a4 = auVar7._12_4_;
    fVar75 = local_9b0 * 1.442695 + 0.5;
    fVar77 = fStack_9ac * 1.442695 + 0.5;
    fVar78 = fStack_9a8 * 1.442695 + 0.5;
    fVar79 = fStack_9a4 * 1.442695 + 0.5;
    local_a90 = CONCAT44(fVar77,fVar75);
    uStack_a88._0_4_ = fVar78;
    uStack_a88._4_4_ = fVar79;
    local_aa0 = CONCAT44((int)fVar77,(int)fVar75);
    uStack_a98._0_4_ = (int)fVar78;
    uStack_a98._4_4_ = (int)fVar79;
    auVar47._8_8_ = uStack_a98;
    auVar47._0_8_ = local_aa0;
    auVar4 = vcvtdq2ps_avx(auVar47);
    auVar48._8_8_ = uStack_a88;
    auVar48._0_8_ = local_a90;
    auVar3 = vcmpps_avx(auVar48,auVar4,1);
    auVar51._8_8_ = 0x3f8000003f800000;
    auVar51._0_8_ = 0x3f8000003f800000;
    auVar3 = vpand_avx(auVar3,auVar51);
    auVar3 = vsubps_avx(auVar4,auVar3);
    auVar52._8_4_ = 0.6933594;
    auVar52._12_4_ = 0.6933594;
    auVar52._0_4_ = 0.6933594;
    auVar52._4_4_ = 0.6933594;
    auVar4 = vfnmadd213ps_fma(auVar52,auVar3,auVar7);
    auVar53._8_4_ = -0.00021219444;
    auVar53._12_4_ = -0.00021219444;
    auVar53._0_4_ = -0.00021219444;
    auVar53._4_4_ = -0.00021219444;
    auVar7 = vfnmadd213ps_fma(auVar53,auVar3,auVar4);
    local_9d0 = auVar7._0_4_;
    fStack_9cc = auVar7._4_4_;
    fStack_9c8 = auVar7._8_4_;
    fStack_9c4 = auVar7._12_4_;
    local_a80._4_4_ = fStack_9cc * fStack_9cc;
    local_a80._0_4_ = local_9d0 * local_9d0;
    fStack_a78 = fStack_9c8 * fStack_9c8;
    fStack_a74 = fStack_9c4 * fStack_9c4;
    uStack_ac8 = 0x3950696739506967;
    local_ad0 = (undefined1  [8])0x3950696739506967;
    auVar55._8_4_ = 0.0013981999;
    auVar55._12_4_ = 0.0013981999;
    auVar55._0_4_ = 0.0013981999;
    auVar55._4_4_ = 0.0013981999;
    auVar4 = vfmadd213ps_fma(auVar7,_local_ad0,auVar55);
    auVar56._8_4_ = 0.008333452;
    auVar56._12_4_ = 0.008333452;
    auVar56._0_4_ = 0.008333452;
    auVar56._4_4_ = 0.008333452;
    auVar4 = vfmadd213ps_fma(auVar7,auVar4,auVar56);
    auVar57._8_4_ = 0.041665796;
    auVar57._12_4_ = 0.041665796;
    auVar57._0_4_ = 0.041665796;
    auVar57._4_4_ = 0.041665796;
    auVar4 = vfmadd213ps_fma(auVar7,auVar4,auVar57);
    auVar58._8_4_ = 0.16666666;
    auVar58._12_4_ = 0.16666666;
    auVar58._0_4_ = 0.16666666;
    auVar58._4_4_ = 0.16666666;
    auVar4 = vfmadd213ps_fma(auVar7,auVar4,auVar58);
    auVar59._8_4_ = 0.5;
    auVar59._12_4_ = 0.5;
    auVar59._0_4_ = 0.5;
    auVar59._4_4_ = 0.5;
    auVar4 = vfmadd213ps_fma(auVar7,auVar4,auVar59);
    auVar4 = vfmadd213ps_fma(_local_a80,auVar4,auVar7);
    local_a50 = auVar4._0_4_;
    fStack_a4c = auVar4._4_4_;
    fStack_a48 = auVar4._8_4_;
    fStack_a44 = auVar4._12_4_;
    local_710 = auVar3._0_4_;
    fStack_70c = auVar3._4_4_;
    fStack_708 = auVar3._8_4_;
    fStack_704 = auVar3._12_4_;
    local_aa0 = CONCAT44((int)fStack_70c,(int)local_710);
    uStack_a98._0_4_ = (int)fStack_708;
    uStack_a98._4_4_ = (int)fStack_704;
    auVar42._8_8_ = uStack_a98;
    auVar42._0_8_ = local_aa0;
    auVar41._8_8_ = 0x7f0000007f;
    auVar41._0_8_ = 0x7f0000007f;
    auVar3 = vpaddd_avx(auVar42,auVar41);
    auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
    local_a00 = auVar3._0_4_;
    fStack_9fc = auVar3._4_4_;
    fStack_9f8 = auVar3._8_4_;
    fStack_9f4 = auVar3._12_4_;
    local_ad0._4_4_ = (fStack_a4c + 1.0) * fStack_9fc;
    local_ad0._0_4_ = (local_a50 + 1.0) * local_a00;
    uStack_ac8._0_4_ = (fStack_a48 + 1.0) * fStack_9f8;
    uStack_ac8._4_4_ = (fStack_a44 + 1.0) * fStack_9f4;
    *local_22e0 = local_ad0;
    local_22e0[1] = uStack_ac8;
    local_22d0 = (undefined1 (*) [32])(*local_22d0 + 0x10);
    local_22e0 = local_22e0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}